

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

int cmSystemTools::WaitForLine
              (cmsysProcess *process,string *line,double timeout,
              vector<char,_std::allocator<char>_> *out,vector<char,_std::allocator<char>_> *err)

{
  long lVar1;
  char cVar2;
  pointer pcVar3;
  int iVar4;
  const_iterator __cbeg_2;
  pointer pcVar5;
  iterator __beg;
  pointer pcVar6;
  long lVar7;
  pointer pcVar8;
  difference_type __offset_1;
  pointer pcVar9;
  difference_type __offset;
  pointer pcVar10;
  iterator __beg_1;
  cmProcessOutput processOutput;
  string strdata;
  int length;
  char *data;
  cmProcessOutput local_b9;
  string local_b8;
  int local_94;
  string *local_90;
  char *local_88;
  cmsysProcess *local_80;
  double local_78;
  string local_70;
  string local_50;
  
  local_90 = line;
  local_80 = process;
  local_78 = timeout;
  std::__cxx11::string::_M_replace((ulong)line,0,(char *)line->_M_string_length,0x66eafa);
  pcVar10 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  pcVar6 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  cmProcessOutput::cmProcessOutput(&local_b9,Auto,0x400);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
LAB_003926ca:
  do {
    pcVar9 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    pcVar5 = pcVar10;
    if (pcVar10 != pcVar9) {
      lVar7 = 0;
      do {
        cVar2 = pcVar10[lVar7];
        if (cVar2 == '\r') {
          if (pcVar10 + lVar7 + 1 == pcVar9) {
            pcVar5 = pcVar10 + lVar7;
            break;
          }
        }
        else if ((cVar2 == '\0') || (cVar2 == '\n')) {
          pcVar6 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pcVar9 = pcVar10 + lVar7;
          if ((1 < (ulong)((long)pcVar9 - (long)pcVar6)) || (pcVar9 != pcVar6)) {
            std::__cxx11::string::append((char *)local_90,(ulong)pcVar6);
            pcVar6 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_start;
          }
          pcVar5 = pcVar10 + lVar7 + 1;
          iVar4 = 2;
          if (pcVar5 != pcVar6) {
            pcVar3 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
            pcVar8 = pcVar9 + 1;
            if (pcVar5 != pcVar3) {
              memmove(pcVar6,pcVar9 + 1,(size_t)(pcVar3 + (~(ulong)pcVar10 - lVar7)));
              pcVar5 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
              pcVar8 = pcVar5;
            }
            if (pcVar5 + ~(ulong)pcVar10 + (long)pcVar6 + -lVar7 != pcVar8) {
              (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
              ._M_finish = pcVar5 + ~(ulong)pcVar10 + (long)pcVar6 + -lVar7;
            }
          }
          goto LAB_00392987;
        }
        lVar1 = lVar7 + 1;
        lVar7 = lVar7 + 1;
        pcVar5 = pcVar9;
      } while (pcVar10 + lVar1 != pcVar9);
    }
    pcVar10 = pcVar5;
    pcVar9 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    pcVar5 = pcVar6;
    if (pcVar6 != pcVar9) {
      lVar7 = 0;
      do {
        cVar2 = pcVar6[lVar7];
        if (cVar2 == '\r') {
          if (pcVar6 + lVar7 + 1 == pcVar9) {
            pcVar5 = pcVar6 + lVar7;
            break;
          }
        }
        else if ((cVar2 == '\0') || (cVar2 == '\n')) {
          pcVar9 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pcVar10 = pcVar6 + lVar7;
          if ((1 < (ulong)((long)pcVar10 - (long)pcVar9)) || (pcVar10 != pcVar9)) {
            std::__cxx11::string::append((char *)local_90,(ulong)pcVar9);
            pcVar9 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_start;
          }
          pcVar5 = pcVar6 + lVar7 + 1;
          iVar4 = 3;
          if (pcVar5 != pcVar9) {
            pcVar3 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
            pcVar8 = pcVar10 + 1;
            if (pcVar5 != pcVar3) {
              memmove(pcVar9,pcVar10 + 1,(size_t)(pcVar3 + (~(ulong)pcVar6 - lVar7)));
              pcVar5 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
              pcVar8 = pcVar5;
            }
            if (pcVar5 + ~(ulong)pcVar6 + (long)pcVar9 + -lVar7 != pcVar8) {
              (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
              ._M_finish = pcVar5 + ~(ulong)pcVar6 + (long)pcVar9 + -lVar7;
            }
          }
          goto LAB_00392987;
        }
        lVar1 = lVar7 + 1;
        lVar7 = lVar7 + 1;
        pcVar5 = pcVar9;
      } while (pcVar6 + lVar1 != pcVar9);
    }
    iVar4 = cmsysProcess_WaitForData(local_80,&local_88,&local_94,&local_78);
    pcVar6 = pcVar5;
    if (2 < iVar4) {
      if (iVar4 == 3) {
        cmProcessOutput::DecodeText(&local_b9,local_88,(long)local_94,&local_b8,2);
        pcVar6 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        pcVar9 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        std::vector<char,std::allocator<char>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  ((vector<char,std::allocator<char>> *)err,pcVar6,local_b8._M_dataplus._M_p,
                   local_b8._M_dataplus._M_p + local_b8._M_string_length);
        pcVar6 = pcVar6 + ((long)(err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                 super__Vector_impl_data._M_start - (long)pcVar9);
      }
      else if (iVar4 == 0xff) {
        iVar4 = 0xff;
        goto LAB_00392987;
      }
      goto LAB_003926ca;
    }
    if (iVar4 == 2) {
      cmProcessOutput::DecodeText(&local_b9,local_88,(long)local_94,&local_b8,1);
      pcVar10 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      pcVar9 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      std::vector<char,std::allocator<char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((vector<char,std::allocator<char>> *)out,pcVar10,local_b8._M_dataplus._M_p,
                 local_b8._M_dataplus._M_p + local_b8._M_string_length);
      pcVar10 = pcVar10 + ((long)(out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                 super__Vector_impl_data._M_start - (long)pcVar9);
    }
    else if (iVar4 == 0) {
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      cmProcessOutput::DecodeText(&local_b9,&local_50,&local_b8,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                 local_50.field_2._M_local_buf[0]) + 1);
      }
      if (local_b8._M_string_length != 0) {
        std::vector<char,std::allocator<char>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  ((vector<char,std::allocator<char>> *)out,
                   (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_finish,local_b8._M_dataplus._M_p,
                   local_b8._M_dataplus._M_p + local_b8._M_string_length);
      }
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      cmProcessOutput::DecodeText(&local_b9,&local_70,&local_b8,2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,
                        CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                 local_70.field_2._M_local_buf[0]) + 1);
      }
      if (local_b8._M_string_length != 0) {
        std::vector<char,std::allocator<char>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  ((vector<char,std::allocator<char>> *)err,
                   (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_finish,local_b8._M_dataplus._M_p,
                   local_b8._M_dataplus._M_p + local_b8._M_string_length);
      }
      pcVar10 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if (pcVar10 ==
          (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
          _M_finish) {
        pcVar10 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (pcVar10 ==
            (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
            _M_finish) {
          iVar4 = 0;
        }
        else {
          std::__cxx11::string::append((char *)local_90,(ulong)pcVar10);
          pcVar10 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          iVar4 = 3;
          if (pcVar10 !=
              (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
              ._M_finish) {
            (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
            _M_finish = pcVar10;
          }
        }
      }
      else {
        std::__cxx11::string::append((char *)local_90,(ulong)pcVar10);
        pcVar10 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        iVar4 = 2;
        if (pcVar10 !=
            (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
            _M_finish) {
          (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
          _M_finish = pcVar10;
        }
      }
LAB_00392987:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,
                        CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                                 local_b8.field_2._M_local_buf[0]) + 1);
      }
      cmProcessOutput::~cmProcessOutput(&local_b9);
      return iVar4;
    }
  } while( true );
}

Assistant:

int cmSystemTools::WaitForLine(cmsysProcess* process, std::string& line,
                               double timeout, std::vector<char>& out,
                               std::vector<char>& err)
{
  line = "";
  std::vector<char>::iterator outiter = out.begin();
  std::vector<char>::iterator erriter = err.begin();
  cmProcessOutput processOutput;
  std::string strdata;
  while (true) {
    // Check for a newline in stdout.
    for (; outiter != out.end(); ++outiter) {
      if ((*outiter == '\r') && ((outiter + 1) == out.end())) {
        break;
      }
      if (*outiter == '\n' || *outiter == '\0') {
        std::vector<char>::size_type length = outiter - out.begin();
        if (length > 1 && *(outiter - 1) == '\r') {
          --length;
        }
        if (length > 0) {
          line.append(&out[0], length);
        }
        out.erase(out.begin(), outiter + 1);
        return cmsysProcess_Pipe_STDOUT;
      }
    }

    // Check for a newline in stderr.
    for (; erriter != err.end(); ++erriter) {
      if ((*erriter == '\r') && ((erriter + 1) == err.end())) {
        break;
      }
      if (*erriter == '\n' || *erriter == '\0') {
        std::vector<char>::size_type length = erriter - err.begin();
        if (length > 1 && *(erriter - 1) == '\r') {
          --length;
        }
        if (length > 0) {
          line.append(&err[0], length);
        }
        err.erase(err.begin(), erriter + 1);
        return cmsysProcess_Pipe_STDERR;
      }
    }

    // No newlines found.  Wait for more data from the process.
    int length;
    char* data;
    int pipe = cmsysProcess_WaitForData(process, &data, &length, &timeout);
    if (pipe == cmsysProcess_Pipe_Timeout) {
      // Timeout has been exceeded.
      return pipe;
    }
    if (pipe == cmsysProcess_Pipe_STDOUT) {
      processOutput.DecodeText(data, length, strdata, 1);
      // Append to the stdout buffer.
      std::vector<char>::size_type size = out.size();
      out.insert(out.end(), strdata.begin(), strdata.end());
      outiter = out.begin() + size;
    } else if (pipe == cmsysProcess_Pipe_STDERR) {
      processOutput.DecodeText(data, length, strdata, 2);
      // Append to the stderr buffer.
      std::vector<char>::size_type size = err.size();
      err.insert(err.end(), strdata.begin(), strdata.end());
      erriter = err.begin() + size;
    } else if (pipe == cmsysProcess_Pipe_None) {
      // Both stdout and stderr pipes have broken.  Return leftover data.
      processOutput.DecodeText(std::string(), strdata, 1);
      if (!strdata.empty()) {
        std::vector<char>::size_type size = out.size();
        out.insert(out.end(), strdata.begin(), strdata.end());
        outiter = out.begin() + size;
      }
      processOutput.DecodeText(std::string(), strdata, 2);
      if (!strdata.empty()) {
        std::vector<char>::size_type size = err.size();
        err.insert(err.end(), strdata.begin(), strdata.end());
        erriter = err.begin() + size;
      }
      if (!out.empty()) {
        line.append(&out[0], outiter - out.begin());
        out.erase(out.begin(), out.end());
        return cmsysProcess_Pipe_STDOUT;
      }
      if (!err.empty()) {
        line.append(&err[0], erriter - err.begin());
        err.erase(err.begin(), err.end());
        return cmsysProcess_Pipe_STDERR;
      }
      return cmsysProcess_Pipe_None;
    }
  }
}